

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O2

void print(bool **arr,string *s)

{
  ostream *poVar1;
  ulong uVar2;
  int i;
  long lVar3;
  int j;
  long lVar4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)s);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar3 = 1; uVar2 = (ulong)bsize, lVar4 = 1, lVar3 <= (long)uVar2; lVar3 = lVar3 + 1) {
    for (; lVar4 <= (int)uVar2; lVar4 = lVar4 + 1) {
      std::ostream::_M_insert<bool>(true);
      uVar2 = (ulong)(uint)bsize;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void print(bool **arr, const string &s) {
    cout << s << endl;
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            cout << arr[i][j];
        }
        cout << endl;
    }
}